

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkloader.c
# Opt level: O3

void setImageLayout(ktxVulkanFunctions vkFuncs,VkCommandBuffer cmdBuffer,VkImage image,
                   VkImageLayout oldLayout,VkImageLayout newLayout,
                   VkImageSubresourceRange subresourceRange)

{
  bool bVar1;
  uint uVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined4 in_register_00000014;
  undefined4 in_R8D;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  VkImageLayout VStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  ulong local_8;
  
  uStack_20 = CONCAT44(in_register_00000014,oldLayout);
  uStack_40 = 0;
  local_38 = 0;
  local_48 = 0x2d;
  local_28 = 0xffffffffffffffff;
  _VStack_30 = CONCAT44(in_R8D,newLayout);
  local_18 = vkFuncs.vkGetInstanceProcAddr._0_4_;
  uStack_14 = vkFuncs.vkGetInstanceProcAddr._4_4_;
  uStack_10 = vkFuncs.vkGetDeviceProcAddr._0_4_;
  uStack_c = vkFuncs.vkGetDeviceProcAddr._4_4_;
  local_8 = (ulong)(uint)vkFuncs.vkAllocateCommandBuffers;
  switch(newLayout) {
  case VK_IMAGE_LAYOUT_UNDEFINED:
    uVar2 = 0x800;
    bVar1 = true;
    goto LAB_001df81f;
  default:
    __assert_fail("KTX_FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                  ,0x6c9,
                  "void setImageLayout(ktxVulkanFunctions, VkCommandBuffer, VkImage, VkImageLayout, VkImageLayout, VkImageSubresourceRange)"
                 );
  case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
    uVar2 = 0x900;
    uVar4 = 0x100;
    break;
  case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
    uVar2 = 0xc00;
    uVar4 = 0x400;
    break;
  case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
    uVar2 = 0x820;
    uVar4 = 0x20;
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
    uVar4 = 0x800;
    uVar2 = 0x800;
    break;
  case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
    uVar2 = 0x1800;
    uVar4 = 0x1000;
    break;
  case VK_IMAGE_LAYOUT_PREINITIALIZED:
    uVar2 = 0x4800;
    uVar4 = 0x4000;
  }
  local_38 = (ulong)uVar4;
  bVar1 = false;
LAB_001df81f:
  switch(in_R8D) {
  case 2:
    local_38 = 0x800;
    uVar3 = 0x100;
    break;
  case 3:
    uVar3 = 0x400;
    break;
  default:
    __assert_fail("KTX_FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/vkloader.c"
                  ,0x6f8,
                  "void setImageLayout(ktxVulkanFunctions, VkCommandBuffer, VkImage, VkImageLayout, VkImageLayout, VkImageSubresourceRange)"
                 );
  case 5:
    uVar3 = 0x20;
    if (bVar1) {
      local_38 = 0x5000;
    }
    break;
  case 6:
    local_38 = (ulong)uVar2;
    uVar3 = 0x800;
    break;
  case 7:
    uVar3 = 0x1000;
  }
  local_38 = CONCAT44(uVar3,(undefined4)local_38);
  (*(code *)cmdBuffer)(image,0x10000,0x10000,0,0,0,0,0,1,&local_48);
  return;
}

Assistant:

static void
setImageLayout(
    ktxVulkanFunctions vkFuncs,
    VkCommandBuffer cmdBuffer,
    VkImage image,
    VkImageLayout oldLayout,
    VkImageLayout newLayout,
    VkImageSubresourceRange subresourceRange)
{
    // Create an image barrier object
    VkImageMemoryBarrier imageMemoryBarrier = {
        .sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,
        .pNext = NULL,
         // Some default values
        .srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED,
        .dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED
    };

    imageMemoryBarrier.oldLayout = oldLayout;
    imageMemoryBarrier.newLayout = newLayout;
    imageMemoryBarrier.image = image;
    imageMemoryBarrier.subresourceRange = subresourceRange;

    // Source layouts (old)
    // The source access mask controls actions to be finished on the old
    // layout before it will be transitioned to the new layout.
    switch (oldLayout)
    {
    case VK_IMAGE_LAYOUT_UNDEFINED:
        // Image layout is undefined (or does not matter).
        // Only valid as initial layout. No flags required.
        imageMemoryBarrier.srcAccessMask = 0;
        break;

    case VK_IMAGE_LAYOUT_PREINITIALIZED:
        // Image is preinitialized.
        // Only valid as initial layout for linear images; preserves memory
        // contents. Make sure host writes have finished.
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_HOST_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
        // Image is a color attachment.
        // Make sure writes to the color buffer have finished
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
        // Image is a depth/stencil attachment.
        // Make sure any writes to the depth/stencil buffer have finished.
        imageMemoryBarrier.srcAccessMask
                                = VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
        // Image is a transfer source.
        // Make sure any reads from the image have finished
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_TRANSFER_READ_BIT;
        break;

    case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
        // Image is a transfer destination.
        // Make sure any writes to the image have finished.
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_TRANSFER_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
        // Image is read by a shader.
        // Make sure any shader reads from the image have finished
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_SHADER_READ_BIT;
        break;

    default:
        /* Value not used by callers, so not supported. */
        assert(KTX_FALSE);
    }

    // Target layouts (new)
    // The destination access mask controls the dependency for the new image
    // layout.
    switch (newLayout)
    {
    case VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL:
        // Image will be used as a transfer destination.
        // Make sure any writes to the image have finished.
        imageMemoryBarrier.dstAccessMask = VK_ACCESS_TRANSFER_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL:
        // Image will be used as a transfer source.
        // Make sure any reads from and writes to the image have finished.
        imageMemoryBarrier.srcAccessMask |= VK_ACCESS_TRANSFER_READ_BIT;
        imageMemoryBarrier.dstAccessMask = VK_ACCESS_TRANSFER_READ_BIT;
        break;

    case VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL:
        // Image will be used as a color attachment.
        // Make sure any writes to the color buffer have finished.
        imageMemoryBarrier.srcAccessMask = VK_ACCESS_TRANSFER_READ_BIT;
        imageMemoryBarrier.dstAccessMask = VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL:
        // Image layout will be used as a depth/stencil attachment.
        // Make sure any writes to depth/stencil buffer have finished.
        imageMemoryBarrier.dstAccessMask
                                = VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT;
        break;

    case VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL:
        // Image will be read in a shader (sampler, input attachment).
        // Make sure any writes to the image have finished.
        if (imageMemoryBarrier.srcAccessMask == 0)
        {
            imageMemoryBarrier.srcAccessMask
                    = VK_ACCESS_HOST_WRITE_BIT | VK_ACCESS_TRANSFER_WRITE_BIT;
        }
        imageMemoryBarrier.dstAccessMask = VK_ACCESS_SHADER_READ_BIT;
        break;
    default:
        /* Value not used by callers, so not supported. */
        assert(KTX_FALSE);
    }

    // Put barrier on top of pipeline.
    VkPipelineStageFlags srcStageFlags = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;
    VkPipelineStageFlags destStageFlags = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

    // Add the barrier to the passed command buffer
    vkFuncs.vkCmdPipelineBarrier(
        cmdBuffer,
        srcStageFlags,
        destStageFlags,
        0,
        0, NULL,
        0, NULL,
        1, &imageMemoryBarrier);
}